

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

FileInfo * __thiscall
anon_unknown.dwarf_1b8a13::CAPIFileSystem::getLinkInfo
          (FileInfo *__return_storage_ptr__,CAPIFileSystem *this,string *path)

{
  _func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *p_Var1;
  void *pvVar2;
  pointer pFVar3;
  char *pcVar4;
  FileInfo *local_88;
  undefined1 local_48 [8];
  llb_fs_file_info_t file_info;
  string *path_local;
  CAPIFileSystem *this_local;
  
  file_info.mod_time.nanoseconds = (uint64_t)path;
  if (((this->cAPIDelegate).fs_get_link_info ==
       (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)0x0) &&
     ((this->cAPIDelegate).fs_get_file_info ==
      (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)0x0)) {
    pFVar3 = std::
             unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
             ::operator->(&this->localFileSystem);
    (*pFVar3->_vptr_FileSystem[8])(__return_storage_ptr__,pFVar3,file_info.mod_time.nanoseconds);
  }
  else {
    if ((this->cAPIDelegate).fs_get_link_info ==
        (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)0x0) {
      p_Var1 = (this->cAPIDelegate).fs_get_file_info;
      pvVar2 = (this->cAPIDelegate).context;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      (*p_Var1)(pvVar2,pcVar4,(llb_fs_file_info_t *)local_48);
    }
    else {
      p_Var1 = (this->cAPIDelegate).fs_get_link_info;
      pvVar2 = (this->cAPIDelegate).context;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      (*p_Var1)(pvVar2,pcVar4,(llb_fs_file_info_t *)local_48);
    }
    __return_storage_ptr__->device = 0;
    __return_storage_ptr__->inode = 0;
    __return_storage_ptr__->mode = 0;
    __return_storage_ptr__->size = 0;
    (__return_storage_ptr__->modTime).seconds = 0;
    (__return_storage_ptr__->modTime).nanoseconds = 0;
    (__return_storage_ptr__->checksum).bytes[0] = '\0';
    local_88 = (FileInfo *)((__return_storage_ptr__->checksum).bytes + 1);
    do {
      *(undefined1 *)&local_88->device = 0;
      local_88 = (FileInfo *)((long)&local_88->device + 1);
    } while (local_88 != __return_storage_ptr__ + 1);
    __return_storage_ptr__->device = (uint64_t)local_48;
    __return_storage_ptr__->inode = file_info.device;
    __return_storage_ptr__->mode = file_info.inode;
    __return_storage_ptr__->size = file_info.mode;
    (__return_storage_ptr__->modTime).seconds = file_info.size;
    (__return_storage_ptr__->modTime).nanoseconds = file_info.mod_time.seconds;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual basic::FileInfo getLinkInfo(const std::string& path) override {
    if (!cAPIDelegate.fs_get_link_info && !cAPIDelegate.fs_get_file_info) {
      return localFileSystem->getLinkInfo(path);
    }

    llb_fs_file_info_t file_info;
    if (cAPIDelegate.fs_get_link_info) {
      cAPIDelegate.fs_get_link_info(cAPIDelegate.context, path.c_str(),
                                    &file_info);
    } else {
      cAPIDelegate.fs_get_file_info(cAPIDelegate.context, path.c_str(),
                                    &file_info);
    }

    basic::FileInfo result{};
    result.device = file_info.device;
    result.inode = file_info.inode;
    result.mode = file_info.mode;
    result.size = file_info.size;
    result.modTime.seconds = file_info.mod_time.seconds;;
    result.modTime.nanoseconds = file_info.mod_time.nanoseconds;
    return result;
  }